

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtr.c
# Opt level: O0

Vec_Ptr_t * Bac_PtrTransformBoxes(Vec_Ptr_t *vBoxes,Vec_Ptr_t *vGatesNames)

{
  int iVar1;
  Vec_Ptr_t *p;
  Vec_Ptr_t *pVVar2;
  Vec_Ptr_t *vNew;
  int i;
  Vec_Ptr_t *vBox;
  Vec_Ptr_t *vGatesNames_local;
  Vec_Ptr_t *vBoxes_local;
  
  iVar1 = Vec_PtrSize(vBoxes);
  p = Vec_PtrAllocExact(iVar1);
  for (vNew._4_4_ = 0; iVar1 = Vec_PtrSize(vBoxes), vNew._4_4_ < iVar1; vNew._4_4_ = vNew._4_4_ + 1)
  {
    pVVar2 = (Vec_Ptr_t *)Vec_PtrEntry(vBoxes,vNew._4_4_);
    pVVar2 = Bac_PtrTransformBox(pVVar2,vGatesNames);
    Vec_PtrPush(p,pVVar2);
  }
  return p;
}

Assistant:

Vec_Ptr_t * Bac_PtrTransformBoxes( Vec_Ptr_t * vBoxes, Vec_Ptr_t * vGatesNames )
{
    Vec_Ptr_t * vBox; int i;
    Vec_Ptr_t * vNew = Vec_PtrAllocExact( Vec_PtrSize(vBoxes) );
    Vec_PtrForEachEntry( Vec_Ptr_t *, vBoxes, vBox, i )
        Vec_PtrPush( vNew, Bac_PtrTransformBox(vBox, vGatesNames) );
    return vNew;
}